

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O2

APInt __thiscall llvm::APInt::sdiv(APInt *this,int64_t RHS)

{
  bool bVar1;
  long in_RDX;
  undefined8 extraout_RDX;
  APInt *this_00;
  APInt AVar3;
  APInt AStack_78;
  APInt local_68;
  APInt local_58;
  APInt local_48;
  APInt local_38;
  undefined8 uVar2;
  
  bVar1 = isNegative((APInt *)RHS);
  if (bVar1) {
    if (in_RDX < 0) {
      this_00 = &local_38;
      APInt(this_00,(APInt *)RHS);
      operator-((llvm *)&AStack_78,this_00);
      udiv(this,(uint64_t)&AStack_78);
    }
    else {
      this_00 = &local_58;
      APInt(this_00,(APInt *)RHS);
      operator-((llvm *)&AStack_78,this_00);
      udiv(&local_48,(uint64_t)&AStack_78);
      operator-((llvm *)this,&local_48);
      ~APInt(&local_48);
    }
    ~APInt(&AStack_78);
  }
  else {
    if (-1 < in_RDX) {
      AVar3 = udiv(this,RHS);
      uVar2 = AVar3._8_8_;
      goto LAB_0019d930;
    }
    this_00 = &local_68;
    udiv(this_00,RHS);
    operator-((llvm *)this,this_00);
  }
  ~APInt(this_00);
  uVar2 = extraout_RDX;
LAB_0019d930:
  AVar3._8_8_ = uVar2;
  AVar3.U.pVal = (uint64_t *)this;
  return AVar3;
}

Assistant:

APInt APInt::sdiv(int64_t RHS) const {
  if (isNegative()) {
    if (RHS < 0)
      return (-(*this)).udiv(-RHS);
    return -((-(*this)).udiv(RHS));
  }
  if (RHS < 0)
    return -(this->udiv(-RHS));
  return this->udiv(RHS);
}